

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O3

int prvTidyReadBOMEncoding(StreamIn *in)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint encoding;
  int iVar4;
  TidyDocImpl *doc;
  void *pvVar5;
  
  iVar1 = (*(in->source).getByte)((in->source).sourceData);
  iVar4 = -1;
  if (iVar1 == -1) {
    return -1;
  }
  iVar2 = (*(in->source).getByte)((in->source).sourceData);
  if (iVar2 == -1) {
    pvVar5 = (in->source).sourceData;
LAB_00135e6a:
    (*(in->source).ungetByte)(pvVar5,(byte)iVar1);
  }
  else {
    iVar3 = iVar1 * 0x100 + iVar2;
    if (iVar3 == 0xfffe) {
      iVar4 = 9;
      if ((in->encoding | 2U) == 0xb) {
        return 9;
      }
      doc = in->doc;
      encoding = 9;
    }
    else {
      if (iVar3 != 0xfeff) {
        iVar3 = (*(in->source).getByte)((in->source).sourceData);
        if (iVar3 == -1) {
          pvVar5 = (in->source).sourceData;
        }
        else {
          if (iVar2 * 0x100 + iVar1 * 0x10000 + iVar3 == 0xefbbbf) {
            iVar4 = 4;
            if (in->encoding == 4) {
              return 4;
            }
            doc = in->doc;
            encoding = 4;
            goto LAB_00135e1b;
          }
          (*(in->source).ungetByte)((in->source).sourceData,(byte)iVar3);
          pvVar5 = (in->source).sourceData;
        }
        (*(in->source).ungetByte)(pvVar5,(byte)iVar2);
        pvVar5 = (in->source).sourceData;
        goto LAB_00135e6a;
      }
      iVar4 = 10;
      if ((in->encoding & 0xfffffffeU) == 10) {
        return 10;
      }
      doc = in->doc;
      encoding = 10;
    }
LAB_00135e1b:
    prvTidyReportEncodingWarning(doc,0x23b,encoding);
  }
  return iVar4;
}

Assistant:

int TY_(ReadBOMEncoding)(StreamIn *in)
{
    uint c, c1;
    uint bom;

    c = ReadByte(in);
    if (c == EndOfStream)
        return -1;

    c1 = ReadByte( in );
    if (c1 == EndOfStream)
    {
        UngetByte(in, c);
        return -1;
    }

    /* todo: dont warn about mismatch for auto input encoding */
    /* todo: let the user override the encoding found here */

    bom = (c << 8) + c1;

    if ( bom == UNICODE_BOM_BE )
    {
        /* big-endian UTF-16 */
        if ( in->encoding != UTF16 && in->encoding != UTF16BE )
            TY_(ReportEncodingWarning)(in->doc, ENCODING_MISMATCH, UTF16BE);

        return UTF16BE; /* return decoded BOM */
    }
    else if (bom == UNICODE_BOM_LE)
    {
        /* little-endian UTF-16 */
        if (in->encoding != UTF16 && in->encoding != UTF16LE)
            TY_(ReportEncodingWarning)(in->doc, ENCODING_MISMATCH, UTF16LE);

        return UTF16LE; /* return decoded BOM */
    }
    else
    {
        uint c2 = ReadByte(in);

        if (c2 == EndOfStream)
        {
            UngetByte(in, c1);
            UngetByte(in, c);
            return -1;
        }

        if (((c << 16) + (c1 << 8) + c2) == UNICODE_BOM_UTF8)
        {
            /* UTF-8 */
            if (in->encoding != UTF8)
                TY_(ReportEncodingWarning)(in->doc, ENCODING_MISMATCH, UTF8);

            return UTF8;
        }
        else
            UngetByte( in, c2 );
    }

    UngetByte(in, c1);
    UngetByte(in, c);

    return -1;
}